

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DSAPrivateKey.cpp
# Opt level: O0

bool __thiscall DSAPrivateKey::deserialise(DSAPrivateKey *this,ByteString *serialised)

{
  size_t sVar1;
  ByteString *in_RDI;
  ByteString dX;
  ByteString dG;
  ByteString dQ;
  ByteString dP;
  undefined1 local_c8 [40];
  undefined1 local_a0 [56];
  undefined1 local_68 [40];
  undefined1 local_40 [63];
  byte local_1;
  
  ByteString::chainDeserialise(in_RDI);
  ByteString::chainDeserialise(in_RDI);
  ByteString::chainDeserialise(in_RDI);
  ByteString::chainDeserialise(in_RDI);
  sVar1 = ByteString::size((ByteString *)0x14eb55);
  if (sVar1 != 0) {
    sVar1 = ByteString::size((ByteString *)0x14eb74);
    if (sVar1 != 0) {
      sVar1 = ByteString::size((ByteString *)0x14eb90);
      if (sVar1 != 0) {
        sVar1 = ByteString::size((ByteString *)0x14ebac);
        if (sVar1 != 0) {
          (*in_RDI->_vptr_ByteString[9])(in_RDI,local_40);
          (*in_RDI->_vptr_ByteString[10])(in_RDI,local_68);
          (*in_RDI->_vptr_ByteString[0xb])(in_RDI,local_a0);
          (*in_RDI->_vptr_ByteString[8])(in_RDI,local_c8);
          local_1 = 1;
          goto LAB_0014ecad;
        }
      }
    }
  }
  local_1 = 0;
LAB_0014ecad:
  ByteString::~ByteString((ByteString *)0x14ecb7);
  ByteString::~ByteString((ByteString *)0x14ecc1);
  ByteString::~ByteString((ByteString *)0x14ecce);
  ByteString::~ByteString((ByteString *)0x14ecdb);
  return (bool)(local_1 & 1);
}

Assistant:

bool DSAPrivateKey::deserialise(ByteString& serialised)
{
	ByteString dP = ByteString::chainDeserialise(serialised);
	ByteString dQ = ByteString::chainDeserialise(serialised);
	ByteString dG = ByteString::chainDeserialise(serialised);
	ByteString dX = ByteString::chainDeserialise(serialised);

	if ((dP.size() == 0) ||
	    (dQ.size() == 0) ||
	    (dG.size() == 0) ||
	    (dX.size() == 0))
	{
		return false;
	}

	setP(dP);
	setQ(dQ);
	setG(dG);
	setX(dX);

	return true;
}